

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.h
# Opt level: O2

void ast::Sections::append8(uint section,uint8_t b)

{
  reference ppSVar1;
  
  ppSVar1 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::at
                      ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)&table,
                       (ulong)section);
  Section::append8(*ppSVar1,b);
  return;
}

Assistant:

static void append8(unsigned section, uint8_t b) {
		table.at(section)->append8(b);
	}